

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

bool __thiscall
OpenCLEnum::queryPlatformInfo
          (OpenCLEnum *this,cl_platform_id platform_id,uint param,string *value,string *param_name,
          size_t max_size)

{
  size_t sVar1;
  string *this_00;
  cl_platform_info cVar2;
  cl_platform_id platform;
  char *pcVar3;
  ostream *poVar4;
  cl_int code;
  bool bVar5;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b8;
  char *local_b0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_a8;
  undefined4 local_9c;
  string local_98;
  allocator_type local_61;
  undefined1 local_60 [8];
  vector<char,_std::allocator<char>_> data;
  size_t sStack_40;
  cl_int res;
  size_t max_size_local;
  string *param_name_local;
  string *value_local;
  cl_platform_id p_Stack_20;
  uint param_local;
  cl_platform_id platform_id_local;
  OpenCLEnum *this_local;
  
  sStack_40 = max_size;
  max_size_local = (size_t)param_name;
  param_name_local = value;
  value_local._4_4_ = param;
  p_Stack_20 = platform_id;
  platform_id_local = (cl_platform_id)this;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_60,max_size,&local_61);
  std::allocator<char>::~allocator(&local_61);
  platform = p_Stack_20;
  cVar2 = value_local._4_4_;
  sVar1 = sStack_40;
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_60);
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       clGetPlatformInfo(platform,cVar2,sVar1,pcVar3,&stack0xffffffffffffffc0);
  this_00 = param_name_local;
  bVar5 = data.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0;
  if (bVar5) {
    local_a8._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_60);
    local_b8._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_60);
    local_b0 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+(&local_b8,sStack_40);
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)this_00,local_a8,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_b0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)param_name_local,pcVar3);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"clGetPlatformInfo(");
    poVar4 = std::operator<<(poVar4,(string *)max_size_local);
    poVar4 = std::operator<<(poVar4,") failed: ");
    ocl::errorString_abi_cxx11_
              (&local_98,
               (ocl *)(ulong)(uint)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   _20_4_,code);
    poVar4 = std::operator<<(poVar4,(string *)&local_98);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_98);
  }
  local_9c = 1;
  this_local._7_1_ = bVar5;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_60)
  ;
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OpenCLEnum::queryPlatformInfo(cl_platform_id platform_id, unsigned int param, std::string &value, const std::string &param_name, size_t max_size)
{
	cl_int res;

	std::vector<char> data(max_size);
	res = clGetPlatformInfo(platform_id, param, max_size, data.data(), &max_size);
	if (res != CL_SUCCESS) {
		std::cerr << "clGetPlatformInfo(" << param_name << ") failed: " << ocl::errorString(res) << std::endl;
		return false;
	}

	value.assign(data.begin(), data.begin() + max_size);
	value = value.c_str();	// remove trailing null chars
	return true;
}